

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::CostAttributes::evaluateCost
          (CostAttributes *this,double time,VectorDynSize *values,double *costValue,string *label)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  element_type *peVar4;
  element_type *peVar5;
  double dVar6;
  double dVar7;
  bool bVar8;
  uint uVar9;
  Index size;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  PointerType pdVar15;
  undefined8 uVar16;
  ostream *poVar17;
  long lVar18;
  ulong uVar19;
  bool isValid;
  ostringstream errorMsg;
  char local_212;
  scalar_sum_op<double,_double> local_211;
  scalar_constant_op<double> *local_210 [2];
  scalar_constant_op<double> local_200 [2];
  PointerType local_1f0;
  variable_if_dynamic<long,__1> local_1e0;
  product_evaluator<Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  local_1d8;
  PointerType local_1c0;
  double *local_1b8;
  double local_1b0;
  undefined1 local_1a8 [48];
  long local_178;
  undefined1 local_160 [304];
  
  if (this->m_valid == false) {
    *costValue = 0.0;
LAB_00167095:
    bVar8 = true;
  }
  else {
    lVar10 = iDynTree::VectorDynSize::size();
    (*((this->selector).
       super___shared_ptr<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_Selector[3])();
    lVar11 = iDynTree::MatrixDynSize::cols();
    if (lVar10 == lVar11) {
      peVar4 = (this->desiredTrajectory).
               super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      (*peVar4->_vptr_TimeVaryingObject[2])(time,peVar4,&local_212);
      if (local_212 == '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Unable to retrieve a valid desired ",0x23);
        poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(label->_M_dataplus)._M_p,label->_M_string_length)
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar17," at time: ",10);
        poVar17 = std::ostream::_M_insert<double>(time);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,".",1);
        std::__cxx11::stringbuf::str();
        iDynTree::reportError("L2NormCost","costEvaluation",(char *)local_210[0]);
      }
      else {
        uVar9 = iDynTree::VectorDynSize::size();
        uVar12 = iDynTree::VectorDynSize::size();
        if (uVar12 == uVar9) {
          peVar5 = (this->selector).
                   super___shared_ptr<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          (*peVar5->_vptr_Selector[2])(peVar5,values);
          lVar10 = iDynTree::VectorDynSize::data();
          iDynTree::VectorDynSize::size();
          lVar11 = iDynTree::VectorDynSize::data();
          iDynTree::VectorDynSize::size();
          uVar13 = iDynTree::VectorDynSize::data();
          uVar14 = iDynTree::VectorDynSize::size();
          uVar12 = uVar14;
          if (((uVar13 & 7) == 0) &&
             (uVar12 = (ulong)((uint)(uVar13 >> 3) & 1), (long)uVar14 <= (long)uVar12)) {
            uVar12 = uVar14;
          }
          lVar18 = uVar14 - uVar12;
          if (0 < (long)uVar12) {
            uVar19 = 0;
            do {
              *(double *)(uVar13 + uVar19 * 8) =
                   *(double *)(lVar10 + uVar19 * 8) - *(double *)(lVar11 + uVar19 * 8);
              uVar19 = uVar19 + 1;
            } while (uVar12 != uVar19);
          }
          uVar19 = (lVar18 - (lVar18 >> 0x3f) & 0xfffffffffffffffeU) + uVar12;
          if (1 < lVar18) {
            do {
              pdVar1 = (double *)(lVar10 + uVar12 * 8);
              dVar6 = pdVar1[1];
              pdVar2 = (double *)(lVar11 + uVar12 * 8);
              dVar7 = pdVar2[1];
              pdVar3 = (double *)(uVar13 + uVar12 * 8);
              *pdVar3 = *pdVar1 - *pdVar2;
              pdVar3[1] = dVar6 - dVar7;
              uVar12 = uVar12 + 2;
            } while ((long)uVar12 < (long)uVar19);
          }
          if ((long)uVar19 < (long)uVar14) {
            do {
              *(double *)(uVar13 + uVar19 * 8) =
                   *(double *)(lVar10 + uVar19 * 8) - *(double *)(lVar11 + uVar19 * 8);
              uVar19 = uVar19 + 1;
            } while (uVar14 != uVar19);
          }
          pdVar15 = (PointerType)iDynTree::VectorDynSize::data();
          lVar10 = iDynTree::VectorDynSize::size();
          local_1c0 = (PointerType)iDynTree::MatrixDynSize::data();
          lVar11 = iDynTree::MatrixDynSize::rows();
          lVar18 = iDynTree::MatrixDynSize::cols();
          uVar16 = iDynTree::VectorDynSize::data();
          local_160._40_8_ = iDynTree::VectorDynSize::size();
          local_1b8 = &local_1b0;
          local_1a8._32_8_ = 0.5;
          local_160._0_8_ = local_1c0;
          if (lVar11 != 0) {
            local_200[0].m_other = 0.5;
            local_1f0 = pdVar15;
            local_1e0.m_value = lVar10;
            local_1a8._24_8_ = lVar10;
            local_1a8._40_8_ = pdVar15;
            local_178 = lVar10;
            local_160._8_8_ = lVar11;
            local_160._16_8_ = lVar18;
            local_160._32_8_ = uVar16;
            Eigen::internal::
            product_evaluator<Eigen::Product<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            ::product_evaluator(&local_1d8,(XprType *)local_160);
            Eigen::internal::
            redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,-1,1,1,-1>const>const,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>const>const>const,Eigen::Product<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>,0>const>>,3,0>
            ::
            run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,_1,1,1,_1>const>const,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>const>const>const,Eigen::Product<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,0>const>>
                      ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>,_const_Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>_>
                        *)local_210,&local_211,
                       (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>,_const_Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                        *)local_1a8);
            free(local_1d8.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data);
          }
          *costValue = *local_1b8;
          goto LAB_00167095;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"The desired ",0xc);
        poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(label->_M_dataplus)._M_p,label->_M_string_length)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar17," dimension does not match the size of the selector at time: ",0x3c);
        poVar17 = std::ostream::_M_insert<double>(time);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,".",1);
        std::__cxx11::stringbuf::str();
        iDynTree::reportError("L2NormCost","costEvaluation",(char *)local_210[0]);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"The ",4);
      poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,(label->_M_dataplus)._M_p,label->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar17," dimension is not the one expected from the specified selector.",0x3f);
      std::__cxx11::stringbuf::str();
      iDynTree::reportError("L2NormCost","costEvaluation",(char *)local_210[0]);
    }
    if (local_210[0] != local_200) {
      operator_delete(local_210[0],(long)local_200[0].m_other + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_160 + 0x28));
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool evaluateCost(double time, const VectorDynSize& values, double& costValue, const std::string &label) {
                if (!isValid()) {
                    costValue = 0.0;
                    return true;
                }

                if (values.size() != selector->asSelectorMatrix().cols()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The " << label <<" dimension is not the one expected from the specified selector.";
                    reportError("L2NormCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                bool isValid;
                const VectorDynSize& desired = desiredTrajectory->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid desired " << label <<" at time: " << time << ".";
                    reportError("L2NormCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                if (selector->size() != desired.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The desired " << label <<" dimension does not match the size of the selector at time: " << time << ".";
                    reportError("L2NormCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                iDynTree::toEigen(buffer) = iDynTree::toEigen(selector->select(values)) - iDynTree::toEigen(desired);


                costValue = 0.5 * iDynTree::toEigen(buffer).transpose() * (iDynTree::toEigen(weightMatrix) * iDynTree::toEigen(buffer));

                return true;
            }